

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::ConeRecord1::operator==(ConeRecord1 *this,ConeRecord1 *Value)

{
  KBOOL KVar1;
  ConeRecord1 *Value_local;
  ConeRecord1 *this_local;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = WorldCoordinates::operator!=(&this->m_Loc,&Value->m_Loc);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = EulerAngles::operator!=(&this->m_Ori,&Value->m_Ori);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32Height != (float)Value->m_f32Height) ||
              (NAN((float)this->m_f32Height) || NAN((float)Value->m_f32Height))) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32PeakAngle != (float)Value->m_f32PeakAngle) ||
              (NAN((float)this->m_f32PeakAngle) || NAN((float)Value->m_f32PeakAngle))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL ConeRecord1::operator == ( const ConeRecord1 & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) ) return false;
    if( m_Loc          != Value.m_Loc )           return false;
    if( m_Ori          != Value.m_Ori )           return false;
    if( m_f32Height    != Value.m_f32Height )     return false;
    if( m_f32PeakAngle != Value.m_f32PeakAngle )  return false;
    return true;
}